

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inference.h
# Opt level: O2

void __thiscall xLearn::Predictor::~Predictor(Predictor *this)

{
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&(this->out_).super__Vector_base<float,_std::allocator<float>_>);
  std::__cxx11::string::~string((string *)&this->out_file_);
  return;
}

Assistant:

~Predictor() { }